

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::hexEscapeChar(ostream *os,uchar c)

{
  _Setfill<char> _Var1;
  fmtflags __fmtfl;
  _Setw _Var2;
  ostream *poVar3;
  void *this;
  undefined8 uVar4;
  fmtflags f;
  uchar c_local;
  ostream *os_local;
  
  __fmtfl = clara::std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  poVar3 = std::operator<<((ostream *)os,"\\x");
  this = (void *)std::ostream::operator<<(poVar3,clara::std::uppercase);
  uVar4 = std::ostream::operator<<(this,clara::std::hex);
  _Var1 = clara::std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = clara::std::setw(2);
  poVar3 = std::operator<<(poVar3,(_Setw)_Var2._M_n);
  std::ostream::operator<<(poVar3,(uint)c);
  clara::std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)),__fmtfl);
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }